

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VInvTestLocal(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 in_register_0000000c;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  sunrealtype sVar10;
  double dVar11;
  double dVar12;
  timespec spec;
  timespec local_40;
  
  if (param_3 < 2) {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length must be >= 2\n",param_3);
    iVar6 = 1;
  }
  else {
    set_element_range(X,0,param_3 + -1,1.0 / (double)(myid + 2));
    N_VConst(0,Z);
    iVar6 = 1;
    clock_gettime(1,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    dVar11 = (double)local_40.tv_nsec;
    iVar2 = N_VInvTestLocal(X,Z);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar12 = (double)local_40.tv_nsec;
    iVar3 = check_ans((double)(myid + 2),Z,param_3);
    if ((iVar3 == 0) && (iVar2 != 0)) {
      iVar6 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VInvTestLocal Case 1");
        iVar6 = 0;
      }
    }
    else {
      printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n",
             CONCAT44(in_register_0000000c,myid));
    }
    max_time(X,(dVar12 / 1000000000.0 + (double)lVar5) - (dVar11 / 1000000000.0 + (double)lVar4));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VInvTestLocal");
    }
    N_VConst(0,Z);
    uVar8 = 1;
    if (1 < param_3) {
      uVar8 = param_3;
    }
    uVar7 = 0;
    do {
      sVar10 = 0.0;
      if ((uVar7 & 1) != 0) {
        sVar10 = 0.5;
      }
      set_element(X,uVar7,sVar10);
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    clock_gettime(1,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    dVar11 = (double)local_40.tv_nsec;
    iVar2 = N_VInvTestLocal(X,Z);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    uVar8 = 1;
    if (1 < param_3) {
      uVar8 = param_3;
    }
    uVar7 = 0;
    bVar1 = false;
    do {
      sVar10 = get_element(Z,uVar7);
      if ((uVar7 & 1) == 0) {
        bVar9 = sVar10 == 0.0;
      }
      else {
        bVar9 = sVar10 == 2.0;
      }
      if ((!bVar9) || (NAN(sVar10))) {
        bVar1 = true;
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    if (bVar1 || iVar2 != 0) {
      printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n");
      iVar6 = iVar6 + 1;
    }
    else if (myid == 0) {
      puts("PASSED test -- N_VInvTestLocal Case 2");
    }
    max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar5) -
               (dVar11 / 1000000000.0 + (double)lVar4));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VInvTestLocal");
    }
  }
  return iVar6;
}

Assistant:

int Test_N_VInvTestLocal(N_Vector X, N_Vector Z, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype xval;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 2)
  {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length "
           "must be >= 2\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: All elements Nonzero, z[i] = 1/x[i], return True
   */

  /* fill vector data */
  xval = ONE / (myid + 2);
  set_element_range(X, 0, local_length - 1, xval);
  N_VConst(ZERO, Z);

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of myid+2 */
  failure = check_ans(myid + 2, Z, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 1\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  /*
   * Case 2: Some elements Zero, z[i] = 1/x[i] for x[i] != 0, return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(ZERO, Z);
  for (i = 0; i < local_length; i++)
  {
    if (i % 2) { set_element(X, i, HALF); }
    else { set_element(X, i, ZERO); }
  }

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    if (i % 2)
    {
      if (get_element(Z, i) != TWO) { failure = 1; }
    }
    else
    {
      if (get_element(Z, i) != ZERO) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 2\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  return (fails);
}